

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void TPZFMatrix<long_double>::PrintStatic
               (longdouble *ptr,int64_t rows,int64_t cols,char *name,ostream *out,
               MatrixOutputFormat form)

{
  longdouble lVar1;
  size_t sVar2;
  ostream *poVar3;
  int64_t iVar4;
  longdouble *plVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  char number [32];
  long local_88;
  char local_58 [40];
  
  if (form == EMathematicaInput) {
    if (name == (char *)0x0) {
      std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
    }
    else {
      sVar2 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n{ ",3);
    if (0 < rows) {
      lVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n{ ",3);
        if (0 < cols) {
          uVar9 = 1;
          lVar8 = 0;
          plVar5 = ptr;
          do {
            sprintf(local_58,"%16.16lf",ABS((double)*plVar5));
            sVar2 = strlen(local_58);
            std::__ostream_insert<char,std::char_traits<char>>(out,local_58,sVar2);
            if (lVar8 < cols + -1) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            }
            if ((uVar9 / 6) * 6 + -1 == lVar8) {
              std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
              std::ostream::put((char)out);
              std::ostream::flush();
            }
            lVar8 = lVar8 + 1;
            uVar9 = uVar9 + 1;
            plVar5 = plVar5 + rows;
          } while (cols != lVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
        if (lVar7 < rows + -1) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        lVar7 = lVar7 + 1;
        ptr = ptr + 1;
      } while (lVar7 != rows);
    }
    pcVar6 = " }\n";
    lVar7 = 3;
  }
  else {
    if (form != EInputFormat) {
      if (form != EFormatted) {
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"Writing matrix \'",0x10);
      if (name != (char *)0x0) {
        sVar2 = strlen(name);
        std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\' (",3);
      poVar3 = std::ostream::_M_insert<long>((long)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," x ",3);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"):\n",3);
      if (0 < rows) {
        lVar7 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
          iVar4 = cols;
          plVar5 = ptr;
          if (0 < cols) {
            do {
              poVar3 = std::ostream::_M_insert<long_double>(*plVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
              plVar5 = plVar5 + rows;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
          lVar7 = lVar7 + 1;
          ptr = ptr + 1;
        } while (lVar7 != rows);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
      return;
    }
    poVar3 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (0 < rows) {
      local_88 = 0;
      do {
        if (0 < cols) {
          lVar7 = 0;
          plVar5 = ptr;
          do {
            lVar1 = *plVar5;
            if ((lVar1 != (longdouble)0) || (NAN(lVar1) || NAN((longdouble)0))) {
              poVar3 = std::ostream::_M_insert<long>((long)out);
              local_58[0] = ' ';
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_58,1);
              poVar3 = std::ostream::_M_insert<long>((long)poVar3);
              local_58[0] = ' ';
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_58,1);
              poVar3 = std::ostream::_M_insert<long_double>(lVar1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
              std::ostream::put((char)poVar3);
              std::ostream::flush();
            }
            lVar7 = lVar7 + 1;
            plVar5 = plVar5 + rows;
          } while (cols != lVar7);
        }
        local_88 = local_88 + 1;
        ptr = ptr + 1;
      } while (local_88 != rows);
    }
    pcVar6 = "-1 -1 0.\n";
    lVar7 = 9;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar6,lVar7);
  return;
}

Assistant:

void TPZFMatrix<TVar>::PrintStatic(const TVar *ptr, int64_t rows, int64_t cols, const char *name, std::ostream& out,const MatrixOutputFormat form){
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << rows << " x " << cols << "):\n";
        
        for ( int64_t row = 0; row < rows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < cols; col++ ) {
                out << SELECTEL(ptr,rows, row, col) << "  ";
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << rows << " " << cols << endl;
        for ( int64_t row = 0; row < rows; row++) {
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
    {
        char number[32];
        out << name << "\n{ ";
        for ( int64_t row = 0; row < rows; row++) {
            out << "\n{ ";
            for ( int64_t col = 0; col < cols; col++ ) {
                TVar val = SELECTEL(ptr,rows,row, col);
                sprintf(number, "%16.16lf", (double)fabs(val));
                out << number;
                if(col < cols-1)
                    out << ", ";
                if((col+1) % 6 == 0)out << std::endl;
            }
            out << " }";
            if(row < rows-1)
                out << ",";
        }
        
        out << " }\n";
        
    }
    
}